

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::MakeNewRCObj<Diligent::ThreadPoolImpl,_Diligent::IMemoryAllocator>::MakeNewRCObj
          (MakeNewRCObj<Diligent::ThreadPoolImpl,_Diligent::IMemoryAllocator> *this,IObject *pOwner)

{
  IObject *pOwner_local;
  MakeNewRCObj<Diligent::ThreadPoolImpl,_Diligent::IMemoryAllocator> *this_local;
  
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  this->m_pOwner = pOwner;
  this->m_dvpDescription = (Char *)0x0;
  this->m_dvpFileName = (char *)0x0;
  this->m_dvpLineNumber = 0;
  return;
}

Assistant:

MakeNewRCObj(IObject* pOwner = nullptr) noexcept :
        // clang-format off
        m_pAllocator    {nullptr},
        m_pOwner        {pOwner }
#ifdef DILIGENT_DEVELOPMENT
      , m_dvpDescription{nullptr}
      , m_dvpFileName   {nullptr}
      , m_dvpLineNumber {0      }
#endif
    // clang-format on
    {}